

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O2

void __thiscall StatAggregator::printValues(StatAggregator *this,samples_t *values,string *unit)

{
  pointer *ppuVar1;
  unsigned_long uVar2;
  pointer ppVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  bool bVar8;
  Stats *stats;
  long lVar9;
  long lVar10;
  pointer pSVar11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var12;
  iterator __begin2;
  pointer puVar13;
  pointer pcVar14;
  pointer ppVar15;
  uint64_t uVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pSVar19;
  unsigned_long *h;
  pointer puVar20;
  long lVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined4 uVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined4 uVar34;
  undefined1 auVar33 [16];
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar35;
  vector<Stats,_std::allocator<Stats>_> value_stats;
  unsigned_long local_c8;
  uint64_t max_for_bin;
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  
  value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppVar3 = (values->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppuVar1 = &histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  for (ppVar15 = (values->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
      ppVar15 = ppVar15 + 1) {
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)histogram.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    if ((ppVar15->second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
        .super__Vector_impl_data._M_finish !=
        (ppVar15->second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
        .super__Vector_impl_data._M_start) {
      std::__cxx11::string::_M_assign((string *)&histogram);
      pvVar4 = ppVar15->second;
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start,
                 (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish);
      dVar22 = std::
               accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double>
                         ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(pvVar4->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )(pvVar4->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish,0.0);
      dVar32 = 0.0;
      puVar13 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar20 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar9 = (long)puVar20 - (long)puVar13;
      lVar10 = lVar9 >> 3;
      auVar24._8_4_ = (int)(lVar9 >> 0x23);
      auVar24._0_8_ = lVar10;
      auVar24._12_4_ = 0x45300000;
      for (; puVar13 != puVar20; puVar13 = puVar13 + 1) {
        uVar2 = *puVar13;
        auVar25._8_4_ = (int)(uVar2 >> 0x20);
        auVar25._0_8_ = uVar2;
        auVar25._12_4_ = 0x45300000;
        dVar26 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                 dVar22 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
        dVar32 = dVar32 + dVar26 * dVar26;
      }
      lVar10 = lVar10 + -1;
      auVar23._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar23._0_8_ = lVar10;
      auVar23._12_4_ = 0x45300000;
      dVar32 = dVar32 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
      if (dVar32 < 0.0) {
        sqrt(dVar32);
      }
      std::vector<Stats,_std::allocator<Stats>_>::push_back(&value_stats,(value_type *)&histogram);
    }
    std::__cxx11::string::~string((string *)&histogram);
  }
  uVar17 = 0xffffffffffffffff;
  uVar18 = 0;
  pSVar11 = value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    uVar29 = (undefined4)(uVar17 >> 0x20);
    uVar34 = (undefined4)(uVar18 >> 0x20);
    if (pSVar11 ==
        value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    auVar28._8_4_ = uVar29;
    auVar28._0_8_ = uVar17;
    auVar28._12_4_ = 0x45300000;
    dVar32 = (auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    dVar22 = pSVar11->pct5;
    if (dVar32 <= pSVar11->pct5) {
      dVar22 = dVar32;
    }
    uVar17 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
    auVar33._8_4_ = uVar34;
    auVar33._0_8_ = uVar18;
    auVar33._12_4_ = 0x45300000;
    dVar32 = (auVar33._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
    dVar22 = pSVar11->pct95;
    if (pSVar11->pct95 <= dVar32) {
      dVar22 = dVar32;
    }
    uVar18 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
    pSVar11 = pSVar11 + 1;
  }
  puts("\n                                Percentile");
  printf("  %-16s Median     95th     99th  Std Dev  Histogram of samples\n\n","");
  pSVar11 = value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pSVar19 = value_stats.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
                 super__Vector_impl_data._M_start; bVar8 = std::operator==(unit,anon_var_dwarf_5e7),
      pSVar19 != pSVar11; pSVar19 = pSVar19 + 1) {
    if (bVar8) {
      pcVar14 = (pSVar19->name)._M_dataplus._M_p;
      dVar32 = pSVar19->median;
      dVar26 = pSVar19->pct95;
      dVar27 = pSVar19->pct99;
      dVar22 = pSVar19->stddev;
    }
    else {
      bVar8 = std::operator==(unit,"ms");
      pcVar14 = (pSVar19->name)._M_dataplus._M_p;
      if (bVar8) {
        dVar22 = 1000.0;
      }
      else {
        dVar22 = 1000000.0;
      }
      dVar32 = pSVar19->median / dVar22;
      dVar26 = pSVar19->pct95 / dVar22;
      dVar27 = pSVar19->pct99 / dVar22;
      dVar22 = pSVar19->stddev / dVar22;
    }
    printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",dVar32,dVar26,dVar27,dVar22,pcVar14);
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar16 = 0;
    lVar9 = 0x20;
    lVar10 = 0;
    while (bVar8 = lVar9 != 0, lVar9 = lVar9 + -1, bVar8) {
      max_for_bin = uVar16;
      _Var12 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         ((pSVar19->values->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start,
                          (pSVar19->values->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish,&max_for_bin);
      lVar21 = (long)_Var12._M_current -
               (long)(pSVar19->values->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      local_c8 = (unsigned_long)((int)lVar21 - (int)lVar10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&histogram,&local_c8);
      uVar16 = uVar16 + (uVar18 >> 5);
      lVar10 = lVar21;
    }
    pVar35 = std::
             __minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    puVar13 = histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar2 = *pVar35.second._M_current._M_current;
    uVar5 = *pVar35.first._M_current._M_current;
    for (puVar20 = histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar13;
        puVar20 = puVar20 + 1) {
      uVar6 = *puVar20;
      uVar7 = *pVar35.first._M_current._M_current;
      putchar(-0x1e);
      putchar(-0x6a);
      putchar((int)(((uVar6 - uVar7) * 7 + 7) / ((uVar2 - uVar5) + 1)) + -0x7f);
    }
    putchar(10);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  if (bVar8) {
    pcVar14 = (unit->_M_dataplus)._M_p;
  }
  else {
    bVar8 = std::operator==(unit,"ms");
    auVar30._8_4_ = uVar29;
    auVar30._0_8_ = uVar17;
    auVar30._12_4_ = 0x45300000;
    pcVar14 = (unit->_M_dataplus)._M_p;
    auVar31._8_4_ = uVar34;
    auVar31._0_8_ = uVar18;
    auVar31._12_4_ = 0x45300000;
    if (bVar8) {
      dVar22 = 1000.0;
    }
    else {
      dVar22 = 1000000.0;
    }
    uVar17 = (ulong)(uint)(int)(((auVar30._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) /
                               dVar22);
    uVar18 = (ulong)(uint)(int)(((auVar31._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) /
                               dVar22);
  }
  printf("%52s  %-14d %s %14d\n","",uVar17,pcVar14,uVar18);
  std::vector<Stats,_std::allocator<Stats>_>::~vector(&value_stats);
  return;
}

Assistant:

void StatAggregator::printValues(samples_t values, std::string unit) {

    // First, calculate mean, median, standard deviation and percentiles
    // of each set of values, both for printing and to derive what the
    // range of the graphs should be.
    std::vector<Stats> value_stats;
    for (const auto& t : values) {
        Stats stats;
        if (t.second->size() == 0) {
            continue;
        }
        stats.name = t.first;
        stats.values = t.second;
        std::vector<uint64_t>& vec = *t.second;

        // Calculate latency percentiles
        std::sort(vec.begin(), vec.end());
        stats.median = vec[(vec.size() * 50) / 100];
        stats.pct5 = vec[(vec.size() * 5) / 100];
        stats.pct95 = vec[(vec.size() * 95) / 100];
        stats.pct99 = vec[(vec.size() * 99) / 100];

        const double sum = std::accumulate(vec.begin(), vec.end(), 0.0);
        stats.mean = sum / vec.size();
        double accum = 0.0;
        for (auto &d : vec) {
            accum += (d - stats.mean) * (d - stats.mean);
        }
        stats.stddev = sqrt(accum / (vec.size() - 1));

        value_stats.push_back(stats);
    }

    // From these find the start and end for the spark graphs which covers the
    // a "reasonable sample" of each value set. We define that as from the 5th
    // to the 95th percentile, so we ensure *all* sets have that range covered.
    uint64_t spark_start = std::numeric_limits<uint64_t>::max();
    uint64_t spark_end = 0;
    for (const auto& stats : value_stats) {
        spark_start = (stats.pct5 < spark_start) ? stats.pct5 : spark_start;
        spark_end = (stats.pct95 > spark_end) ? stats.pct95 : spark_end;
    }

    printf("\n                                Percentile\n");
    printf("  %-16s Median     95th     99th  Std Dev  "
            "Histogram of samples\n\n", "");
    // Finally, print out each set.
    for (const auto& stats : value_stats) {
        if (unit == "µs") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median, stats.pct95,
                    stats.pct99, stats.stddev);
        } else if (unit == "ms") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e3, stats.pct95/1e3,
                    stats.pct99/1e3, stats.stddev/1e3);
        } else {    // unit == "s"
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e6, stats.pct95/1e6,
                    stats.pct99/1e6, stats.stddev/1e6);
        }

        // Calculate and render Sparkline (requires UTF-8 terminal).
        const int nbins = 32;
        int prev_distance = 0;
        std::vector<size_t> histogram;
        for (unsigned int bin = 0; bin < nbins; bin++) {
            const uint64_t max_for_bin = (spark_end / nbins) * bin;
            auto it = std::lower_bound(stats.values->begin(),
                                       stats.values->end(),
                                       max_for_bin);
            const int distance = std::distance(stats.values->begin(), it);
            histogram.push_back(distance - prev_distance);
            prev_distance = distance;
        }

        const auto minmax = std::minmax_element(histogram.begin(),
                                                histogram.end());
        const size_t range = *minmax.second - *minmax.first + 1;
        const int levels = 8;
        for (const auto& h : histogram) {
            int bar_size = ((h - *minmax.first + 1) * (levels - 1)) / range;
            putchar('\xe2');
            putchar('\x96');
            putchar('\x81' + bar_size);
        }
        putchar('\n');
    }
    if (unit == "µs") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start), unit.c_str(), int(spark_end));
    } else if (unit == "ms") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e3), unit.c_str(), int(spark_end/1e3));
    } else {    // unit == "s"
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e6), unit.c_str(), int(spark_end/1e6));
    }
}